

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprDoWhile * AnalyzeDoWhile(ExpressionContext *ctx,SynDoWhile *syntax)

{
  TypeBase *pTVar1;
  ScopeData *pSVar2;
  int iVar3;
  ExprBase *pEVar4;
  undefined4 extraout_var;
  SynBase *pSVar6;
  ExprDoWhile *pEVar7;
  FunctionData *onwerFunction;
  IntrusiveList<ExprBase> expressions;
  IntrusiveList<ExprBase> local_48;
  ExprBase *local_38;
  ExprBase *pEStack_30;
  ExprBase *pEVar5;
  undefined4 extraout_var_00;
  
  ExpressionContext::PushLoopScope(ctx,true,true);
  local_48.head = (ExprBase *)0x0;
  local_48.tail = (ExprBase *)0x0;
  for (pSVar6 = (syntax->expressions).head; pSVar6 != (SynBase *)0x0; pSVar6 = pSVar6->next) {
    pEVar4 = AnalyzeStatement(ctx,pSVar6);
    IntrusiveList<ExprBase>::push_back(&local_48,pEVar4);
  }
  pEVar4 = AnalyzeExpression(ctx,syntax->condition);
  pEVar4 = CreateConditionCast(ctx,pEVar4->source,pEVar4);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar5 = (ExprBase *)CONCAT44(extraout_var,iVar3);
  pTVar1 = ctx->typeVoid;
  local_38 = local_48.head;
  pEStack_30 = local_48.tail;
  pSVar6 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
  for (pSVar2 = ctx->scope; (pSVar2 != (ScopeData *)0x0 && (pSVar2->ownerType == (TypeBase *)0x0));
      pSVar2 = pSVar2->scope) {
    onwerFunction = pSVar2->ownerFunction;
    if (onwerFunction != (FunctionData *)0x0) goto LAB_001fd2e3;
  }
  onwerFunction = (FunctionData *)0x0;
LAB_001fd2e3:
  pSVar6 = (SynBase *)CreateBlockUpvalueClose(ctx,pSVar6,onwerFunction,ctx->scope);
  pEVar5->typeID = 0x36;
  pEVar5->source = &syntax->super_SynBase;
  pEVar5->type = pTVar1;
  pEVar5->next = (ExprBase *)0x0;
  pEVar5->listed = false;
  pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6c88;
  pEVar5[1]._vptr_ExprBase = (_func_int **)local_38;
  *(ExprBase **)&pEVar5[1].typeID = pEStack_30;
  pEVar5[1].source = pSVar6;
  ExpressionContext::PopScope(ctx,SCOPE_LOOP,true);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
  pEVar7 = (ExprDoWhile *)CONCAT44(extraout_var_00,iVar3);
  pTVar1 = ctx->typeVoid;
  (pEVar7->super_ExprBase).typeID = 0x32;
  (pEVar7->super_ExprBase).source = &syntax->super_SynBase;
  (pEVar7->super_ExprBase).type = pTVar1;
  (pEVar7->super_ExprBase).next = (ExprBase *)0x0;
  (pEVar7->super_ExprBase).listed = false;
  (pEVar7->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e7040;
  pEVar7->body = pEVar5;
  pEVar7->condition = pEVar4;
  return pEVar7;
}

Assistant:

ExprDoWhile* AnalyzeDoWhile(ExpressionContext &ctx, SynDoWhile *syntax)
{
	ctx.PushLoopScope(true, true);

	IntrusiveList<ExprBase> expressions;

	for(SynBase *expression = syntax->expressions.head; expression; expression = expression->next)
		expressions.push_back(AnalyzeStatement(ctx, expression));

	ExprBase *condition = AnalyzeExpression(ctx, syntax->condition);

	condition = CreateConditionCast(ctx, condition->source, condition);

	ExprBase *block = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, expressions, CreateBlockUpvalueClose(ctx, ctx.MakeInternal(syntax), ctx.GetCurrentFunction(ctx.scope), ctx.scope));

	ctx.PopScope(SCOPE_LOOP);

	return new (ctx.get<ExprDoWhile>()) ExprDoWhile(syntax, ctx.typeVoid, block, condition);
}